

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::MapContainsBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  bool bVar2;
  pointer pEVar3;
  undefined8 uVar4;
  reference this;
  long in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType max_child_type;
  LogicalType *key;
  LogicalType *map;
  LogicalType *in_stack_00000468;
  LogicalType *in_stack_fffffffffffffe58;
  LogicalType *in_stack_fffffffffffffe60;
  LogicalType *in_stack_fffffffffffffe68;
  LogicalType *in_stack_fffffffffffffe70;
  LogicalType *in_stack_fffffffffffffe78;
  LogicalType *in_stack_fffffffffffffe80;
  ClientContext *in_stack_fffffffffffffe88;
  allocator *paVar5;
  ParameterNotResolvedException *in_stack_fffffffffffffea0;
  LogicalType *in_stack_fffffffffffffed0;
  LogicalType *in_stack_fffffffffffffed8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  BinderException *in_stack_ffffffffffffff30;
  string local_a0 [39];
  allocator local_79;
  string local_78 [72];
  LogicalType *local_30;
  LogicalType *local_28;
  long local_18;
  
  local_18 = in_RDX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe60);
  local_28 = &pEVar3->return_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe60);
  local_30 = &pEVar3->return_type;
  LVar1 = LogicalType::id(local_28);
  if (LVar1 == UNKNOWN) {
    uVar4 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(in_stack_fffffffffffffea0);
    __cxa_throw(uVar4,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  LVar1 = LogicalType::id(local_30);
  if (LVar1 == UNKNOWN) {
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe60,
               (size_type)in_stack_fffffffffffffe58);
    LogicalType::operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    MapType::KeyType((LogicalType *)0x1244e74);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe60,
               (size_type)in_stack_fffffffffffffe58);
    LogicalType::operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  else {
    LogicalType::LogicalType((LogicalType *)0x1244eae);
    MapType::KeyType((LogicalType *)0x1244ec8);
    bVar2 = LogicalType::TryGetMaxLogicalType
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,in_stack_fffffffffffffe70);
    if (!bVar2) {
      uVar6 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      paVar5 = &local_79;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_78,
                 "%s: Cannot match element of type \'%s\' in a map of type \'%s\' - an explicit cast is required"
                 ,paVar5);
      ::std::__cxx11::string::string(local_a0,(string *)(local_18 + 8));
      LogicalType::ToString_abi_cxx11_(in_stack_00000468);
      LogicalType::ToString_abi_cxx11_(in_stack_00000468);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar6,in_stack_ffffffffffffff18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff10._M_pi);
      __cxa_throw(uVar4,&BinderException::typeinfo,BinderException::~BinderException);
    }
    LogicalType::LogicalType(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    MapType::ValueType((LogicalType *)0x12450e8);
    LogicalType::LogicalType(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    LogicalType::MAP(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe60,
               (size_type)in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe60 = (LogicalType *)&stack0xffffffffffffff00;
    LogicalType::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    LogicalType::~LogicalType((LogicalType *)0x1245159);
    LogicalType::~LogicalType((LogicalType *)0x1245163);
    LogicalType::~LogicalType((LogicalType *)0x1245170);
    this = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe60,
                      (size_type)in_stack_fffffffffffffe58);
    LogicalType::operator=(this,in_stack_fffffffffffffe60);
    LogicalType::~LogicalType((LogicalType *)0x12451ae);
  }
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> MapContainsBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	const auto &map = arguments[0]->return_type;
	const auto &key = arguments[1]->return_type;

	if (map.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}

	if (key.id() == LogicalTypeId::UNKNOWN) {
		// Infer the argument type from the map type
		bound_function.arguments[0] = map;
		bound_function.arguments[1] = MapType::KeyType(map);
	} else {
		LogicalType max_child_type;
		if (!LogicalType::TryGetMaxLogicalType(context, MapType::KeyType(map), key, max_child_type)) {
			throw BinderException(
			    "%s: Cannot match element of type '%s' in a map of type '%s' - an explicit cast is required",
			    bound_function.name, key.ToString(), map.ToString());
		}

		bound_function.arguments[0] = LogicalType::MAP(max_child_type, MapType::ValueType(map));
		bound_function.arguments[1] = max_child_type;
	}
	return nullptr;
}